

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O0

void __thiscall
wasm::StructUtils::FunctionStructValuesMap<wasm::PossibleConstantValues>::FunctionStructValuesMap
          (FunctionStructValuesMap<wasm::PossibleConstantValues> *this,Module *wasm)

{
  bool bVar1;
  pointer local_40;
  reference local_38;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range3;
  Module *wasm_local;
  FunctionStructValuesMap<wasm::PossibleConstantValues> *this_local;
  
  std::
  unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
  ::unordered_map(&this->
                   super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                 );
  __end3 = std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::begin(&wasm->functions);
  func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         std::
         vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ::end(&wasm->functions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                *)&func);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
               ::operator*(&__end3);
    local_40 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(local_38);
    std::
    unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
    ::operator[](&this->
                  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                 ,&local_40);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end3);
  }
  return;
}

Assistant:

FunctionStructValuesMap(Module& wasm) {
    // Initialize the data for each function in preparation for parallel
    // computation.
    for (auto& func : wasm.functions) {
      (*this)[func.get()];
    }
  }